

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhashfunctions.h
# Opt level: O0

result_type __thiscall
QtPrivate::QHashCombine::operator()(QHashCombine *this,size_t seed,unsigned_long_long *t)

{
  size_t sVar1;
  ulong in_RSI;
  size_t in_stack_ffffffffffffffd8;
  ulong uVar2;
  
  uVar2 = in_RSI;
  sVar1 = ::qHash(in_RSI,in_stack_ffffffffffffffd8);
  return uVar2 ^ sVar1 + 0x9e3779b9 + in_RSI * 0x40 + (in_RSI >> 2);
}

Assistant:

constexpr result_type operator()(size_t seed, const T &t) const
        noexcept(noexcept(qHash(t, seed)))
    // combiner taken from N3876 / boost::hash_combine
    { return seed ^ (qHash(t, size_t(0)) + 0x9e3779b9 + (seed << 6) + (seed >> 2)); }